

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void lowbd_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int8_t *piVar2;
  int i;
  long lVar3;
  __m128i *palVar4;
  long lVar5;
  __m128i *out;
  int bit;
  undefined1 auVar6 [16];
  undefined1 in_XMM1 [16];
  __m128i bufB [32];
  __m128i bufA [32];
  __m128i buf0 [64];
  __m128i buf1 [256];
  
  piVar2 = av1_fwd_txfm_shift_ls[0xb];
  palVar4 = buf1;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    load_buffer_16bit_to_16bit(input + lVar3 * 8,stride,buf0,0x40);
    round_shift_16bit(buf0,0x40,(int)*piVar2);
    av1_fdct8x64_new_sse2(buf0,buf0,'\r');
    round_shift_16bit(buf0,0x40,(int)piVar2[1]);
    out = palVar4;
    for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x80) {
      transpose_16bit_8x8((__m128i *)((long)buf0[0] + lVar5),out);
      out = out + 0x20;
    }
    palVar4 = palVar4 + 8;
  }
  palVar4 = buf1;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x10) {
      auVar6 = *(undefined1 (*) [16])((long)*palVar4 + lVar5);
      in_XMM1 = pmovsxwd(in_XMM1,auVar6);
      *(undefined1 (*) [16])((long)bufA[0] + lVar5) = in_XMM1;
      auVar6._0_8_ = auVar6._8_8_;
      auVar6 = pmovsxwd(auVar6,auVar6);
      *(undefined1 (*) [16])((long)bufB[0] + lVar5) = auVar6;
    }
    bit = 1;
    av1_fdct32_sse4_1(bufA,bufA,0xb,1);
    av1_fdct32_sse4_1(bufB,bufB,0xb,1);
    cVar1 = piVar2[2];
    av1_round_shift_rect_array_32_sse4_1(bufA,bufA,-(int)cVar1,bit,bd);
    av1_round_shift_rect_array_32_sse4_1(bufB,bufB,-(int)cVar1,bit,bd);
    store_output_32bit_w8(output + lVar3 * 8,bufA,bufB,bit,bd);
    palVar4 = palVar4 + 0x20;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_32X64;
  __m128i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[32];
    __m128i bufB[32];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct32_sse4_1(bufA, bufA, cos_bit_row, 1);
    av1_fdct32_sse4_1(bufB, bufB, cos_bit_row, 1);
    av1_round_shift_rect_array_32_sse4_1(bufA, bufA, 32, -shift[2], NewSqrt2);
    av1_round_shift_rect_array_32_sse4_1(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}